

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,false>>
::
copy_or_move_values_in_order<phmap::priv::btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,false>>const>
          (btree<phmap::priv::set_params<int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,256,false>>
           *this,btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                 *x)

{
  bool bVar1;
  value_type *pvVar2;
  const_iterator cVar3;
  iterator iVar4;
  const_iterator x_00;
  iterator iter_00;
  const_iterator local_88;
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  *local_78;
  int local_70;
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  *local_68;
  int local_60;
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  *local_58;
  int local_50;
  const_iterator local_48;
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  *local_38;
  int local_30;
  undefined1 local_28 [8];
  const_iterator iter;
  btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  *x_local;
  btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
  *this_local;
  
  iter._8_8_ = x;
  bVar1 = btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
          ::empty((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                   *)this);
  if (bVar1) {
    cVar3 = btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
            ::begin((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                     *)iter._8_8_);
    local_38 = cVar3.node;
    local_30 = cVar3.position;
    local_28 = (undefined1  [8])local_38;
    iter.node._0_4_ = local_30;
    cVar3 = btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
            ::end((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                   *)iter._8_8_);
    local_58 = cVar3.node;
    local_50 = cVar3.position;
    local_48.node = local_58;
    local_48.position = local_50;
    bVar1 = btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_const_int_&,_const_int_*>
            ::operator==((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_const_int_&,_const_int_*>
                          *)local_28,&local_48);
    if (!bVar1) {
      local_68 = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                  *)local_28;
      local_60 = (int)iter.node;
      cVar3.position = (int)iter.node;
      cVar3.node = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                    *)local_28;
      cVar3._12_4_ = 0;
      pvVar2 = btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
               ::maybe_move_from_iterator
                         ((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                           *)this,cVar3);
      iVar4 = insert_multi<int_const&>(this,pvVar2);
      local_78 = iVar4.node;
      local_70 = iVar4.position;
      btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_const_int_&,_const_int_*>
      ::operator++((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_const_int_&,_const_int_*>
                    *)local_28);
      while( true ) {
        cVar3 = btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                ::end((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                       *)iter._8_8_);
        local_88.node = cVar3.node;
        local_88.position = cVar3.position;
        bVar1 = btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_const_int_&,_const_int_*>
                ::operator!=((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_const_int_&,_const_int_*>
                              *)local_28,&local_88);
        if (!bVar1) break;
        iVar4 = btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                ::end((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                       *)this);
        x_00.position = (int)iter.node;
        x_00.node = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                     *)local_28;
        x_00._12_4_ = 0;
        pvVar2 = btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                 ::maybe_move_from_iterator
                           ((btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                             *)this,x_00);
        iter_00._12_4_ = 0;
        iter_00.node = (btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>
                        *)SUB128(iVar4._0_12_,0);
        iter_00.position = SUB124(iVar4._0_12_,8);
        internal_emplace<int_const&>(this,iter_00,pvVar2);
        btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_const_int_&,_const_int_*>
        ::operator++((btree_iterator<const_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_false>_>,_const_int_&,_const_int_*>
                      *)local_28);
      }
    }
    return;
  }
  __assert_fail("empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x9a5,
                "void phmap::priv::btree<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, false>>::copy_or_move_values_in_order(Btree *) [Params = phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, false>, Btree = const phmap::priv::btree<phmap::priv::set_params<int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<int>, 256, false>>]"
               );
}

Assistant:

void btree<P>::copy_or_move_values_in_order(Btree *x) {
        static_assert(std::is_same<btree, Btree>::value ||
                      std::is_same<const btree, Btree>::value,
                      "Btree type must be same or const.");
        assert(empty());

        // We can avoid key comparisons because we know the order of the
        // values is the same order we'll store them in.
        auto iter = x->begin();
        if (iter == x->end()) return;
        insert_multi(maybe_move_from_iterator(iter));
        ++iter;
        for (; iter != x->end(); ++iter) {
            // If the btree is not empty, we can just insert the new value at the end
            // of the tree.
            internal_emplace(end(), maybe_move_from_iterator(iter));
        }
    }